

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgt.c
# Opt level: O0

opj_tgt_tree_t * tgt_init(opj_tgt_tree_t *p_tree,OPJ_UINT32 p_num_leafs_h,OPJ_UINT32 p_num_leafs_v)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  opj_tgt_node_t *poVar4;
  OPJ_UINT32 in_EDX;
  OPJ_UINT32 in_ESI;
  opj_tgt_tree_t *in_RDI;
  OPJ_UINT32 l_node_size;
  OPJ_UINT32 n;
  OPJ_UINT32 l_num_levels;
  OPJ_INT32 k;
  OPJ_INT32 j;
  OPJ_UINT32 i;
  opj_tgt_node_t *l_parent_node0;
  opj_tgt_node_t *l_parent_node;
  opj_tgt_node_t *l_node;
  OPJ_INT32 l_nplv [32];
  OPJ_INT32 l_nplh [32];
  uint local_140;
  int local_13c;
  uint local_138;
  uint local_134;
  opj_tgt_node *local_130;
  opj_tgt_node *local_128;
  opj_tgt_node_t *local_120;
  int local_118 [32];
  int local_98 [34];
  opj_tgt_tree_t *local_10;
  opj_tgt_tree_t *local_8;
  
  if (in_RDI == (opj_tgt_tree_t *)0x0) {
    local_8 = (opj_tgt_tree_t *)0x0;
  }
  else {
    local_10 = in_RDI;
    if ((in_RDI->numleafsh != in_ESI) || (in_RDI->numleafsv != in_EDX)) {
      in_RDI->numleafsh = in_ESI;
      in_RDI->numleafsv = in_EDX;
      local_140 = 0;
      in_RDI->numnodes = 0;
      uVar3 = local_140;
      do {
        local_140 = uVar3;
        iVar1 = local_98[local_140];
        iVar2 = local_118[local_140];
        local_98[local_140 + 1] = (local_98[local_140] + 1) / 2;
        local_118[local_140 + 1] = (local_118[local_140] + 1) / 2;
        local_10->numnodes = iVar1 * iVar2 + local_10->numnodes;
        uVar3 = local_140 + 1;
      } while (1 < (uint)(iVar1 * iVar2));
      if (local_10->numnodes == 0) {
        tgt_destroy((opj_tgt_tree_t *)0x2cfc17);
        return (opj_tgt_tree_t *)0x0;
      }
      uVar3 = local_10->numnodes * 0x18;
      if (local_10->nodes_size < uVar3) {
        poVar4 = (opj_tgt_node_t *)realloc(local_10->nodes,(ulong)uVar3);
        local_10->nodes = poVar4;
        if (local_10->nodes == (opj_tgt_node_t *)0x0) {
          tgt_destroy((opj_tgt_tree_t *)0x2cfc8f);
          return (opj_tgt_tree_t *)0x0;
        }
        memset((void *)((long)&local_10->nodes->parent + (ulong)local_10->nodes_size),0,
               (ulong)(uVar3 - local_10->nodes_size));
        local_10->nodes_size = uVar3;
      }
      local_120 = local_10->nodes;
      local_130 = local_10->nodes + local_10->numleafsh * local_10->numleafsv;
      local_128 = local_130;
      for (local_134 = 0; local_134 < local_140; local_134 = local_134 + 1) {
        for (local_138 = 0; (int)local_138 < local_118[local_134]; local_138 = local_138 + 1) {
          local_13c = local_98[local_134];
          while (-1 < local_13c + -1) {
            local_120->parent = local_128;
            local_13c = local_13c + -2;
            poVar4 = local_120 + 1;
            if (-1 < local_13c) {
              local_120[1].parent = local_128;
              poVar4 = local_120 + 2;
            }
            local_120 = poVar4;
            local_128 = local_128 + 1;
          }
          if (((local_138 & 1) == 0) && (local_138 != local_118[local_134] - 1U)) {
            local_128 = local_130;
            local_130 = local_130 + local_98[local_134];
          }
          else {
            local_130 = local_128;
          }
        }
      }
      local_120->parent = (opj_tgt_node *)0x0;
    }
    tgt_reset(local_10);
    local_8 = local_10;
  }
  return local_8;
}

Assistant:

opj_tgt_tree_t *tgt_init(opj_tgt_tree_t * p_tree,OPJ_UINT32 p_num_leafs_h, OPJ_UINT32 p_num_leafs_v)
{
	OPJ_INT32 l_nplh[32];
	OPJ_INT32 l_nplv[32];
	opj_tgt_node_t *l_node = 00;
	opj_tgt_node_t *l_parent_node = 00;
	opj_tgt_node_t *l_parent_node0 = 00;
	OPJ_UINT32 i;
	OPJ_INT32 j,k;
	OPJ_UINT32 l_num_levels;
	OPJ_UINT32 n;
	OPJ_UINT32 l_node_size;

	if
		(! p_tree)
	{
		return 00;
	}
	if
		((p_tree->numleafsh != p_num_leafs_h) || (p_tree->numleafsv != p_num_leafs_v))
	{
		p_tree->numleafsh = p_num_leafs_h;
		p_tree->numleafsv = p_num_leafs_v;

		l_num_levels = 0;
		l_nplh[0] = p_num_leafs_h;
		l_nplv[0] = p_num_leafs_v;
		p_tree->numnodes = 0;
		do
		{
			n = l_nplh[l_num_levels] * l_nplv[l_num_levels];
			l_nplh[l_num_levels + 1] = (l_nplh[l_num_levels] + 1) / 2;
			l_nplv[l_num_levels + 1] = (l_nplv[l_num_levels] + 1) / 2;
			p_tree->numnodes += n;
			++l_num_levels;
		}
		while (n > 1);

		/* ADD */
		if
			(p_tree->numnodes == 0)
		{
			tgt_destroy(p_tree);
            return 00;
		}
		l_node_size = p_tree->numnodes * sizeof(opj_tgt_node_t);
		if
			(l_node_size > p_tree->nodes_size)
		{
			p_tree->nodes = (opj_tgt_node_t*) opj_realloc(p_tree->nodes, l_node_size);
			if
				(! p_tree->nodes)
			{
				tgt_destroy(p_tree);
				return 00;
			}
			memset(((char *) p_tree->nodes) + p_tree->nodes_size, 0 , l_node_size - p_tree->nodes_size);
			p_tree->nodes_size = l_node_size;
		}
		l_node = p_tree->nodes;
		l_parent_node = &p_tree->nodes[p_tree->numleafsh * p_tree->numleafsv];
		l_parent_node0 = l_parent_node;

		for
			(i = 0; i < l_num_levels - 1; ++i)
		{
			for
				(j = 0; j < l_nplv[i]; ++j)
			{
				k = l_nplh[i];
				while
					(--k >= 0)
				{
					l_node->parent = l_parent_node;
					++l_node;
					if (--k >= 0)
					{
						l_node->parent = l_parent_node;
						++l_node;
					}
					++l_parent_node;
				}
				if ((j & 1) || j == l_nplv[i] - 1)
				{
					l_parent_node0 = l_parent_node;
				}
				else
				{
					l_parent_node = l_parent_node0;
					l_parent_node0 += l_nplh[i];
				}
			}
		}
		l_node->parent = 0;
	}
	tgt_reset(p_tree);

	return p_tree;
}